

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

void __thiscall
nestl::impl::detail::
rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
::m_move_data(rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
              *this,rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                    *x)

{
  base_ptr prVar1;
  base_ptr *pprVar2;
  link_type prVar3;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
  *x_local;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
  *this_local;
  
  pprVar2 = m_root(x);
  prVar1 = *pprVar2;
  pprVar2 = m_root(this);
  *pprVar2 = prVar1;
  pprVar2 = m_leftmost(x);
  prVar1 = *pprVar2;
  pprVar2 = m_leftmost(this);
  *pprVar2 = prVar1;
  pprVar2 = m_rightmost(x);
  prVar1 = *pprVar2;
  pprVar2 = m_rightmost(this);
  *pprVar2 = prVar1;
  prVar3 = m_end(this);
  pprVar2 = m_root(this);
  (*pprVar2)->m_parent = &prVar3->super_rb_tree_node_base;
  pprVar2 = m_root(x);
  *pprVar2 = (base_ptr)0x0;
  prVar3 = m_end(x);
  pprVar2 = m_leftmost(x);
  *pprVar2 = &prVar3->super_rb_tree_node_base;
  prVar3 = m_end(x);
  pprVar2 = m_rightmost(x);
  *pprVar2 = &prVar3->super_rb_tree_node_base;
  (this->m_impl).m_node_count = (x->m_impl).m_node_count;
  (x->m_impl).m_node_count = 0;
  return;
}

Assistant:

void
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_move_data(rb_tree& x, std::true_type) NESTL_NOEXCEPT_SPEC
{
    m_root() = x.m_root();
    m_leftmost() = x.m_leftmost();
    m_rightmost() = x.m_rightmost();
    m_root()->m_parent = m_end();

    x.m_root() = 0;
    x.m_leftmost() = x.m_end();
    x.m_rightmost() = x.m_end();

    this->m_impl.m_node_count = x.m_impl.m_node_count;
    x.m_impl.m_node_count = 0;
}